

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

bool __thiscall QWizardPrivate::buttonLayoutContains(QWizardPrivate *this,WizardButton which)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  WizardButton *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = true;
  if ((*(byte *)(in_RDI + 0x398) & 1) != 0) {
    local_19 = QListSpecialMethodsBase<QWizard::WizardButton>::contains<QWizard::WizardButton>
                         ((QListSpecialMethodsBase<QWizard::WizardButton> *)
                          CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizardPrivate::buttonLayoutContains(QWizard::WizardButton which)
{
    return !buttonsHaveCustomLayout || buttonsCustomLayout.contains(which);
}